

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qimagescale_sse4.cpp
# Opt level: O2

void qt_qimageScaleAARGBA_down_xy_sse4<false>
               (QImageScaleInfo *isi,uint *dest,int dw,int dh,int dow,int sow)

{
  char cVar1;
  ulong uVar2;
  QThreadPool *pQVar3;
  undefined8 *puVar4;
  undefined8 *puVar5;
  ulong uVar6;
  int iVar7;
  int iVar8;
  long in_FS_OFFSET;
  anon_class_64_8_c6d6aeed local_b8;
  int *yapoints;
  int *xapoints;
  int *xpoints;
  uint **ypoints;
  int sow_local;
  int dow_local;
  int dw_local;
  uint *dest_local;
  undefined1 *local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_b8.dest = &dest_local;
  local_b8.dw = &dw_local;
  local_b8.dow = &dow_local;
  local_b8.sow = &sow_local;
  ypoints = isi->ypoints;
  local_b8.ypoints = &ypoints;
  xpoints = isi->xpoints;
  local_b8.xpoints = &xpoints;
  xapoints = isi->xapoints;
  local_b8.xapoints = &xapoints;
  yapoints = isi->yapoints;
  local_b8.yapoints = &yapoints;
  uVar2 = ((long)isi->sw * (long)isi->sh) / 0x10000;
  uVar6 = uVar2 & 0xffffffff;
  if (dh <= (int)uVar2) {
    uVar6 = (ulong)(uint)dh;
  }
  sow_local = sow;
  dow_local = dow;
  dw_local = dw;
  dest_local = dest;
  pQVar3 = QGuiApplicationPrivate::qtGuiThreadPool();
  if ((pQVar3 != (QThreadPool *)0x0) && (1 < (int)uVar6)) {
    QThread::currentThread();
    cVar1 = QThreadPool::contains((QThread *)pQVar3);
    if (cVar1 == '\0') {
      local_40 = &DAT_aaaaaaaaaaaaaaaa;
      iVar7 = 0;
      QSemaphore::QSemaphore((QSemaphore *)&local_40,0);
      while( true ) {
        iVar8 = (int)uVar6;
        uVar6 = (ulong)(iVar8 - 1);
        if (iVar8 == 0) break;
        iVar8 = (dh - iVar7) / iVar8;
        puVar4 = (undefined8 *)operator_new(0x18);
        *(undefined1 *)(puVar4 + 1) = 1;
        *puVar4 = QFactoryLoader::keyMap;
        puVar5 = (undefined8 *)operator_new(0x20);
        *puVar5 = QRunnable::QGenericRunnable::
                  Helper<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qt[P]qtbase/src/gui/painting/qimagescale_sse4.cpp:34:31)>
                  ::impl;
        *(int *)(puVar5 + 1) = iVar7;
        *(int *)((long)puVar5 + 0xc) = iVar8;
        puVar5[2] = &local_b8;
        puVar5[3] = &local_40;
        puVar4[2] = puVar5;
        QThreadPool::start((QRunnable *)pQVar3,(int)puVar4);
        iVar7 = iVar7 + iVar8;
      }
      QSemaphore::acquire((int)(QSemaphore *)&local_40);
      QSemaphore::~QSemaphore((QSemaphore *)&local_40);
      goto LAB_0051aa68;
    }
  }
  qt_qimageScaleAARGBA_down_xy_sse4<false>::anon_class_64_8_c6d6aeed::operator()(&local_b8,0,dh);
LAB_0051aa68:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void qt_qimageScaleAARGBA_down_xy_sse4(QImageScaleInfo *isi, unsigned int *dest,
                                       int dw, int dh, int dow, int sow)
{
    const unsigned int **ypoints = isi->ypoints;
    int *xpoints = isi->xpoints;
    int *xapoints = isi->xapoints;
    int *yapoints = isi->yapoints;

    auto scaleSection = [&] (int yStart, int yEnd) {
        for (int y = yStart; y < yEnd; ++y) {
            int Cy = yapoints[y] >> 16;
            int yap = yapoints[y] & 0xffff;
            const __m128i vCy = _mm_set1_epi32(Cy);
            const __m128i vyap = _mm_set1_epi32(yap);

            unsigned int *dptr = dest + (y * dow);
            for (int x = 0; x < dw; x++) {
                const int Cx = xapoints[x] >> 16;
                const int xap = xapoints[x] & 0xffff;
                const __m128i vCx = _mm_set1_epi32(Cx);
                const __m128i vxap = _mm_set1_epi32(xap);

                const unsigned int *sptr = ypoints[y] + xpoints[x];
                __m128i vx = qt_qimageScaleAARGBA_helper(sptr, xap, Cx, 1, vxap, vCx);
                __m128i vr = _mm_mullo_epi32(_mm_srli_epi32(vx, 4), vyap);

                int j;
                for (j = (1 << 14) - yap; j > Cy; j -= Cy) {
                    sptr += sow;
                    vx = qt_qimageScaleAARGBA_helper(sptr, xap, Cx, 1, vxap, vCx);
                    vr = _mm_add_epi32(vr, _mm_mullo_epi32(_mm_srli_epi32(vx, 4), vCy));
                }
                sptr += sow;
                vx = qt_qimageScaleAARGBA_helper(sptr, xap, Cx, 1, vxap, vCx);
                vr = _mm_add_epi32(vr, _mm_mullo_epi32(_mm_srli_epi32(vx, 4), _mm_set1_epi32(j)));

                vr = _mm_srli_epi32(vr, 24);
                vr = _mm_packus_epi32(vr, _mm_setzero_si128());
                vr = _mm_packus_epi16(vr, _mm_setzero_si128());
                *dptr = _mm_cvtsi128_si32(vr);
                if (RGB)
                    *dptr |= 0xff000000;
                dptr++;
            }
        }
    };
    multithread_pixels_function(isi, dh, scaleSection);
}